

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Int64ToDoubleMap::Int64ToDoubleMap(Int64ToDoubleMap *this)

{
  Int64ToDoubleMap *pIVar1;
  Int64ToDoubleMap *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Int64ToDoubleMap_00d51610;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::internal::
  MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  ::MapFieldLite(&this->map_);
  pIVar1 = internal_default_instance();
  if (this != pIVar1) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

Int64ToDoubleMap::Int64ToDoubleMap()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Int64ToDoubleMap)
}